

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O1

Result __thiscall wabt::ExprVisitor::HandleDefaultState(ExprVisitor *this,Expr *expr)

{
  int iVar1;
  Enum EVar2;
  BlockExprBase<(wabt::ExprType)7> *block_expr;
  State state;
  
  switch(expr->type_) {
  case AtomicLoad:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x34])(this->delegate_,expr);
    break;
  case AtomicRmw:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x36])(this->delegate_,expr);
    break;
  case AtomicRmwCmpxchg:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x37])(this->delegate_,expr);
    break;
  case AtomicStore:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x35])(this->delegate_,expr);
    break;
  case AtomicWait:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x32])(this->delegate_,expr);
    break;
  case AtomicWake:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x33])(this->delegate_,expr);
    break;
  case Binary:
    iVar1 = (*this->delegate_->_vptr_Delegate[2])(this->delegate_,expr);
    break;
  case Block:
    iVar1 = (*this->delegate_->_vptr_Delegate[3])(this->delegate_,expr);
    state = Block;
    goto LAB_00f595d9;
  case Br:
    iVar1 = (*this->delegate_->_vptr_Delegate[5])(this->delegate_,expr);
    break;
  case BrIf:
    iVar1 = (*this->delegate_->_vptr_Delegate[6])(this->delegate_,expr);
    break;
  case BrTable:
    iVar1 = (*this->delegate_->_vptr_Delegate[7])(this->delegate_,expr);
    break;
  case Call:
    iVar1 = (*this->delegate_->_vptr_Delegate[8])(this->delegate_,expr);
    break;
  case CallIndirect:
    iVar1 = (*this->delegate_->_vptr_Delegate[9])(this->delegate_,expr);
    break;
  case Compare:
    iVar1 = (*this->delegate_->_vptr_Delegate[10])(this->delegate_,expr);
    break;
  case Const:
    iVar1 = (*this->delegate_->_vptr_Delegate[0xb])(this->delegate_,expr);
    break;
  case Convert:
    iVar1 = (*this->delegate_->_vptr_Delegate[0xc])(this->delegate_,expr);
    break;
  case Drop:
    iVar1 = (*this->delegate_->_vptr_Delegate[0xd])(this->delegate_,expr);
    break;
  case GetGlobal:
    iVar1 = (*this->delegate_->_vptr_Delegate[0xe])(this->delegate_,expr);
    break;
  case GetLocal:
    iVar1 = (*this->delegate_->_vptr_Delegate[0xf])(this->delegate_,expr);
    break;
  case If:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x10])(this->delegate_,expr);
    state = IfTrue;
    goto LAB_00f595d9;
  case IfExcept:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x13])(this->delegate_,expr);
    state = IfExceptTrue;
    goto LAB_00f595d9;
  case Load:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x16])(this->delegate_,expr);
    break;
  case Loop:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x17])(this->delegate_,expr);
    state = Loop;
    goto LAB_00f595d9;
  case MemoryCopy:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x19])(this->delegate_,expr);
    break;
  case MemoryDrop:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x1a])(this->delegate_,expr);
    break;
  case MemoryFill:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x1b])(this->delegate_,expr);
    break;
  case MemoryGrow:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x1c])(this->delegate_,expr);
    break;
  case MemoryInit:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x1d])(this->delegate_,expr);
    break;
  case MemorySize:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x1e])(this->delegate_,expr);
    break;
  case Nop:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x22])(this->delegate_,expr);
    break;
  case Rethrow:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x31])(this->delegate_,expr);
    break;
  case Return:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x23])(this->delegate_,expr);
    break;
  case ReturnCall:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x24])(this->delegate_,expr);
    break;
  case ReturnCallIndirect:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x25])(this->delegate_,expr);
    break;
  case Select:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x26])(this->delegate_,expr);
    break;
  case SetGlobal:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x27])(this->delegate_,expr);
    break;
  case SetLocal:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x28])(this->delegate_,expr);
    break;
  case SimdLaneOp:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x39])(this->delegate_,expr);
    break;
  case SimdShuffleOp:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x3a])(this->delegate_,expr);
    break;
  case Store:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x29])(this->delegate_,expr);
    break;
  case TableInit:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x21])(this->delegate_,expr);
    break;
  case TableCopy:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x1f])(this->delegate_,expr);
    break;
  case TableDrop:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x20])(this->delegate_,expr);
    break;
  case TeeLocal:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x2a])(this->delegate_,expr);
    break;
  case Ternary:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x38])(this->delegate_,expr);
    break;
  case Throw:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x30])(this->delegate_,expr);
    break;
  case Try:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x2d])(this->delegate_,expr);
    state = Try;
LAB_00f595d9:
    if (iVar1 == 1) {
      return (Result)Error;
    }
    PushExprlist(this,state,expr,(ExprList *)&expr[3].loc.filename.size_);
    goto switchD_00f59210_default;
  case Unary:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x2b])(this->delegate_,expr);
    break;
  case Last:
    iVar1 = (*this->delegate_->_vptr_Delegate[0x2c])(this->delegate_,expr);
    break;
  default:
    goto switchD_00f59210_default;
  }
  EVar2 = Error;
  if (iVar1 != 1) {
switchD_00f59210_default:
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result ExprVisitor::HandleDefaultState(Expr* expr) {
  switch (expr->type()) {
    case ExprType::AtomicLoad:
      CHECK_RESULT(delegate_->OnAtomicLoadExpr(cast<AtomicLoadExpr>(expr)));
      break;

    case ExprType::AtomicStore:
      CHECK_RESULT(delegate_->OnAtomicStoreExpr(cast<AtomicStoreExpr>(expr)));
      break;

    case ExprType::AtomicRmw:
      CHECK_RESULT(delegate_->OnAtomicRmwExpr(cast<AtomicRmwExpr>(expr)));
      break;

    case ExprType::AtomicRmwCmpxchg:
      CHECK_RESULT(
          delegate_->OnAtomicRmwCmpxchgExpr(cast<AtomicRmwCmpxchgExpr>(expr)));
      break;

    case ExprType::AtomicWait:
      CHECK_RESULT(delegate_->OnAtomicWaitExpr(cast<AtomicWaitExpr>(expr)));
      break;

    case ExprType::AtomicWake:
      CHECK_RESULT(delegate_->OnAtomicWakeExpr(cast<AtomicWakeExpr>(expr)));
      break;

    case ExprType::Binary:
      CHECK_RESULT(delegate_->OnBinaryExpr(cast<BinaryExpr>(expr)));
      break;

    case ExprType::Block: {
      auto block_expr = cast<BlockExpr>(expr);
      CHECK_RESULT(delegate_->BeginBlockExpr(block_expr));
      PushExprlist(State::Block, expr, block_expr->block.exprs);
      break;
    }

    case ExprType::Br:
      CHECK_RESULT(delegate_->OnBrExpr(cast<BrExpr>(expr)));
      break;

    case ExprType::BrIf:
      CHECK_RESULT(delegate_->OnBrIfExpr(cast<BrIfExpr>(expr)));
      break;

    case ExprType::BrTable:
      CHECK_RESULT(delegate_->OnBrTableExpr(cast<BrTableExpr>(expr)));
      break;

    case ExprType::Call:
      CHECK_RESULT(delegate_->OnCallExpr(cast<CallExpr>(expr)));
      break;

    case ExprType::CallIndirect:
      CHECK_RESULT(delegate_->OnCallIndirectExpr(cast<CallIndirectExpr>(expr)));
      break;

    case ExprType::Compare:
      CHECK_RESULT(delegate_->OnCompareExpr(cast<CompareExpr>(expr)));
      break;

    case ExprType::Const:
      CHECK_RESULT(delegate_->OnConstExpr(cast<ConstExpr>(expr)));
      break;

    case ExprType::Convert:
      CHECK_RESULT(delegate_->OnConvertExpr(cast<ConvertExpr>(expr)));
      break;

    case ExprType::Drop:
      CHECK_RESULT(delegate_->OnDropExpr(cast<DropExpr>(expr)));
      break;

    case ExprType::GetGlobal:
      CHECK_RESULT(delegate_->OnGetGlobalExpr(cast<GetGlobalExpr>(expr)));
      break;

    case ExprType::GetLocal:
      CHECK_RESULT(delegate_->OnGetLocalExpr(cast<GetLocalExpr>(expr)));
      break;

    case ExprType::If: {
      auto if_expr = cast<IfExpr>(expr);
      CHECK_RESULT(delegate_->BeginIfExpr(if_expr));
      PushExprlist(State::IfTrue, expr, if_expr->true_.exprs);
      break;
    }

    case ExprType::IfExcept: {
      auto if_except_expr = cast<IfExceptExpr>(expr);
      CHECK_RESULT(delegate_->BeginIfExceptExpr(if_except_expr));
      PushExprlist(State::IfExceptTrue, expr, if_except_expr->true_.exprs);
      break;
    }

    case ExprType::Load:
      CHECK_RESULT(delegate_->OnLoadExpr(cast<LoadExpr>(expr)));
      break;

    case ExprType::Loop: {
      auto loop_expr = cast<LoopExpr>(expr);
      CHECK_RESULT(delegate_->BeginLoopExpr(loop_expr));
      PushExprlist(State::Loop, expr, loop_expr->block.exprs);
      break;
    }

    case ExprType::MemoryCopy:
      CHECK_RESULT(delegate_->OnMemoryCopyExpr(cast<MemoryCopyExpr>(expr)));
      break;

    case ExprType::MemoryDrop:
      CHECK_RESULT(delegate_->OnMemoryDropExpr(cast<MemoryDropExpr>(expr)));
      break;

    case ExprType::MemoryFill:
      CHECK_RESULT(delegate_->OnMemoryFillExpr(cast<MemoryFillExpr>(expr)));
      break;

    case ExprType::MemoryGrow:
      CHECK_RESULT(delegate_->OnMemoryGrowExpr(cast<MemoryGrowExpr>(expr)));
      break;

    case ExprType::MemoryInit:
      CHECK_RESULT(delegate_->OnMemoryInitExpr(cast<MemoryInitExpr>(expr)));
      break;

    case ExprType::MemorySize:
      CHECK_RESULT(delegate_->OnMemorySizeExpr(cast<MemorySizeExpr>(expr)));
      break;

    case ExprType::TableCopy:
      CHECK_RESULT(delegate_->OnTableCopyExpr(cast<TableCopyExpr>(expr)));
      break;

    case ExprType::TableDrop:
      CHECK_RESULT(delegate_->OnTableDropExpr(cast<TableDropExpr>(expr)));
      break;

    case ExprType::TableInit:
      CHECK_RESULT(delegate_->OnTableInitExpr(cast<TableInitExpr>(expr)));
      break;

    case ExprType::Nop:
      CHECK_RESULT(delegate_->OnNopExpr(cast<NopExpr>(expr)));
      break;

    case ExprType::Rethrow:
      CHECK_RESULT(delegate_->OnRethrowExpr(cast<RethrowExpr>(expr)));
      break;

    case ExprType::Return:
      CHECK_RESULT(delegate_->OnReturnExpr(cast<ReturnExpr>(expr)));
      break;

    case ExprType::ReturnCall:
      CHECK_RESULT(delegate_->OnReturnCallExpr(cast<ReturnCallExpr>(expr)));
      break;

    case ExprType::ReturnCallIndirect:
      CHECK_RESULT(delegate_->OnReturnCallIndirectExpr(
          cast<ReturnCallIndirectExpr>(expr)));
      break;

    case ExprType::Select:
      CHECK_RESULT(delegate_->OnSelectExpr(cast<SelectExpr>(expr)));
      break;

    case ExprType::SetGlobal:
      CHECK_RESULT(delegate_->OnSetGlobalExpr(cast<SetGlobalExpr>(expr)));
      break;

    case ExprType::SetLocal:
      CHECK_RESULT(delegate_->OnSetLocalExpr(cast<SetLocalExpr>(expr)));
      break;

    case ExprType::Store:
      CHECK_RESULT(delegate_->OnStoreExpr(cast<StoreExpr>(expr)));
      break;

    case ExprType::TeeLocal:
      CHECK_RESULT(delegate_->OnTeeLocalExpr(cast<TeeLocalExpr>(expr)));
      break;

    case ExprType::Throw:
      CHECK_RESULT(delegate_->OnThrowExpr(cast<ThrowExpr>(expr)));
      break;

    case ExprType::Try: {
      auto try_expr = cast<TryExpr>(expr);
      CHECK_RESULT(delegate_->BeginTryExpr(try_expr));
      PushExprlist(State::Try, expr, try_expr->block.exprs);
      break;
    }

    case ExprType::Unary:
      CHECK_RESULT(delegate_->OnUnaryExpr(cast<UnaryExpr>(expr)));
      break;

    case ExprType::Ternary:
      CHECK_RESULT(delegate_->OnTernaryExpr(cast<TernaryExpr>(expr)));
      break;

    case ExprType::SimdLaneOp: {
      CHECK_RESULT(delegate_->OnSimdLaneOpExpr(cast<SimdLaneOpExpr>(expr)));
      break;
    }

    case ExprType::SimdShuffleOp: {
      CHECK_RESULT(
          delegate_->OnSimdShuffleOpExpr(cast<SimdShuffleOpExpr>(expr)));
      break;
    }

    case ExprType::Unreachable:
      CHECK_RESULT(delegate_->OnUnreachableExpr(cast<UnreachableExpr>(expr)));
      break;
  }

  return Result::Ok;
}